

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

SliceParameter * __thiscall caffe::SliceParameter::New(SliceParameter *this,Arena *arena)

{
  SliceParameter *this_00;
  
  this_00 = (SliceParameter *)operator_new(0x30);
  SliceParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::SliceParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

SliceParameter* SliceParameter::New(::google::protobuf::Arena* arena) const {
  SliceParameter* n = new SliceParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}